

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

int __thiscall
ApprovalTests::Options::clone
          (Options *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code usingDefaultScrubber;
  Reporter *reporter;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<ApprovalTests::ApprovalNamer> local_70;
  _Any_data local_60;
  _Manager_type local_50;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  char local_28 [16];
  
  local_40 = *__child_stack;
  local_38._M_p = local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)((long)__child_stack + 8),
             *(long *)((long)__child_stack + 0x10) + *(long *)((long)__child_stack + 8),___flags);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_60,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(__fn + 0x28));
  reporter = *(Reporter **)(__fn + 0x48);
  local_70.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(__fn + 0x50);
  usingDefaultScrubber = __fn[0x60];
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__fn + 0x58);
  local_70.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Options(this,(FileOptions *)local_40,(Scrubber *)&local_60,reporter,(bool)usingDefaultScrubber,
            &local_70);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      Options(this,(FileOptions *)local_40,(Scrubber *)&local_60,reporter,(bool)usingDefaultScrubber
              ,&local_70);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00113a12;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      Options(this,(FileOptions *)local_40,(Scrubber *)&local_60,reporter,(bool)usingDefaultScrubber
              ,&local_70);
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00113a12:
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_38._M_p != local_28) {
    operator_delete(local_38._M_p);
  }
  return (int)this;
}

Assistant:

Options Options::clone(const Options::FileOptions& fileOptions) const
    {
        // TODO error this can retain a previous Options* ???
        return Options(fileOptions, scrubber_, reporter_, usingDefaultScrubber_, namer_);
    }